

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_export.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalExport::GetData
          (PhysicalExport *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  ostream *poVar1;
  GlobalSourceState *pGVar2;
  ClientContext *context_00;
  pointer pcVar3;
  bool bVar4;
  pointer pbVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var6;
  PhysicalExport *pPVar7;
  pointer prVar8;
  int iVar9;
  pointer pCVar10;
  Catalog *catalog;
  undefined4 extraout_var;
  pointer pCVar11;
  pointer pBVar12;
  reference pvVar13;
  type pCVar14;
  ostream *poVar15;
  reference pvVar16;
  iterator iVar17;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *pvVar18;
  iterator iVar19;
  pointer pbVar20;
  pointer prVar21;
  case_insensitive_map_t<vector<Value>_> *this_00;
  SQLString *in_R8;
  FileSystem *this_01;
  _Hash_node_base *p_Var22;
  size_type __n;
  bool bVar23;
  optional_ptr<duckdb::DependencyManager,_true> dependency_manager;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> create_info;
  string file_path;
  stringstream load_ss;
  stringstream ss;
  string local_590;
  Value local_570;
  ulong local_530;
  PhysicalExport *local_528;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *local_520;
  catalog_entry_vector_t local_518;
  FileSystem *local_4f8;
  type local_4f0;
  optional_ptr<duckdb::DependencyManager,_true> local_4e8;
  key_type local_4e0;
  key_type local_4c0;
  undefined8 *local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined4 local_488;
  undefined1 local_484;
  GlobalSourceState *local_480;
  string local_478;
  string local_458;
  undefined1 local_438 [32];
  string local_418;
  _Alloc_hider local_3f8;
  char local_3e8 [16];
  _Alloc_hider local_3d8;
  size_type local_3d0;
  char local_3c8 [16];
  pointer local_3b8;
  pointer local_3b0;
  string local_3a0;
  __node_base *local_380 [2];
  __node_base local_370 [2];
  string local_360;
  undefined1 local_340 [128];
  ios_base aiStack_2c0 [264];
  undefined1 local_1b8 [16];
  pointer local_1a8;
  ios_base aiStack_138 [264];
  
  pGVar2 = input->global_state;
  if (*(char *)&pGVar2[1]._vptr_GlobalSourceState == '\0') {
    context_00 = context->client;
    local_4f8 = FileSystem::GetFileSystem(context_00);
    local_520 = &this->info;
    pCVar10 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                        (local_520);
    catalog = Catalog::GetCatalog(context_00,&pCVar10->catalog);
    local_518.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_518.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_518.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetNaiveExportOrder((catalog_entry_vector_t *)local_1b8,context->client,catalog);
    prVar8 = local_518.
             super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_518.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8._0_8_;
    local_518.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8._8_8_;
    local_518.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1a8;
    local_1b8._0_8_ = (pointer)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8 = (pointer)0x0;
    if (prVar8 != (pointer)0x0) {
      operator_delete(prVar8);
    }
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_);
    }
    iVar9 = (*catalog->_vptr_Catalog[0x1a])(catalog);
    local_4e8.ptr = (DependencyManager *)CONCAT44(extraout_var,iVar9);
    if (local_4e8.ptr != (DependencyManager *)0x0) {
      optional_ptr<duckdb::DependencyManager,_true>::CheckValid(&local_4e8);
      DependencyManager::ReorderEntries(local_4e8.ptr,&local_518,context_00);
    }
    local_528 = this;
    local_480 = pGVar2;
    ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    prVar8 = local_518.
             super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_518.
        super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_518.
        super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      prVar21 = local_518.
                super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (prVar21->_M_data->internal == false) {
          (*prVar21->_M_data->_vptr_CatalogEntry[8])
                    ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                      *)local_438);
          pCVar11 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                    operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                                *)local_438);
          (pCVar11->catalog)._M_string_length = 0;
          *(pCVar11->catalog)._M_dataplus._M_p = '\0';
          pCVar11 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                    operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                                *)local_438);
          (*(pCVar11->super_ParseInfo)._vptr_ParseInfo[5])(local_340,pCVar11);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,(char *)CONCAT71(local_340._1_7_,local_340[0]),
                     local_340._8_8_);
          if ((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]) != local_340 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]));
          }
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,";\n",2);
          if ((CreateInfo *)local_438._0_8_ != (CreateInfo *)0x0) {
            (**(code **)(*(long *)local_438._0_8_ + 8))();
          }
        }
        prVar21 = prVar21 + 1;
      } while (prVar21 != prVar8);
    }
    local_340[0] = (stringstream)0xa;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,local_340,1);
    pCVar10 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                        (local_520);
    this_01 = local_4f8;
    local_438._0_8_ = (long)local_438 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"schema.sql","");
    pPVar7 = local_528;
    FileSystem::JoinPath((string *)local_340,this_01,&pCVar10->file_path,(string *)local_438);
    WriteStringStreamToFile(this_01,(stringstream *)local_1b8,(string *)local_340);
    if ((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]) != local_340 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]));
    }
    if (local_438._0_8_ != (long)local_438 + 0x10) {
      operator_delete((void *)local_438._0_8_);
    }
    ::std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    local_528 = (PhysicalExport *)&pPVar7->exported_tables;
    poVar1 = (ostream *)(local_340 + 0x10);
    local_530 = 0;
    while (pBVar12 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                     ::operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                                   *)local_528),
          local_530 <
          (ulong)(((long)(pBVar12->data).
                         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         .
                         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pBVar12->data).
                         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         .
                         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333)) {
      pBVar12 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                ::operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                              *)local_528);
      pvVar13 = vector<duckdb::ExportedTableInfo,_true>::operator[](&pBVar12->data,local_530);
      ExportedTableData::ExportedTableData((ExportedTableData *)local_438,&pvVar13->table_data);
      pCVar14 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                          (local_520);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"COPY ",5);
      iVar9 = ::std::__cxx11::string::compare((char *)&local_418);
      if ((iVar9 != 0) && (local_418._M_string_length != 0)) {
        KeywordHelper::WriteOptionallyQuoted((string *)&local_570,&local_418,'\"',true);
        poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar1,(char *)local_570.type_._0_8_,
                             (long)local_570.type_.type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,".",1);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_570.type_._0_8_ !=
            &local_570.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_570.type_._0_8_);
        }
      }
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,local_3d8._M_p,local_3d8._M_p + local_3d0);
      local_570.type_._0_8_ =
           &local_570.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_570.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_2_
           = 0x5c;
      local_570.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&DAT_00000001;
      local_590.field_2._M_allocated_capacity._0_2_ = 0x2f;
      local_590._M_string_length = 1;
      local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
      StringUtil::Replace(&local_360,&local_458,(string *)&local_570,&local_590);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_570.type_._0_8_ !=
          &local_570.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
        operator_delete((void *)local_570.type_._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p);
      }
      local_4a0 = &local_490;
      local_490 = 0x204d4f5246207325;
      local_488 = 0x28207325;
      local_498 = 0xc;
      local_484 = 0;
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_478,local_438._0_8_,(pointer)(local_438._0_8_ + local_438._8_8_));
      local_380[0] = local_370;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_380,local_360._M_dataplus._M_p,
                 local_360._M_dataplus._M_p + local_360._M_string_length);
      StringUtil::Format<duckdb::SQLIdentifier,duckdb::SQLString>
                ((string *)&local_570,(StringUtil *)&local_4a0,&local_478,(SQLIdentifier *)local_380
                 ,in_R8);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(char *)local_570.type_._0_8_,
                 (long)local_570.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_570.type_._0_8_ !=
          &local_570.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
        operator_delete((void *)local_570.type_._0_8_);
      }
      if (local_380[0] != local_370) {
        operator_delete(local_380[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p);
      }
      if (local_4a0 != &local_490) {
        operator_delete(local_4a0);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"FORMAT \'",8);
      poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar1,(pCVar14->format)._M_dataplus._M_p,
                           (pCVar14->format)._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\'",1);
      local_4f0 = pCVar14;
      iVar9 = ::std::__cxx11::string::compare((char *)&pCVar14->format);
      if (iVar9 == 0) {
        this_00 = &local_4f0->options;
        pp_Var6 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  &local_570.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ = 'e';
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _5_1_ = 'r';
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_2_ = 0x6568;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _2_2_ = 0x6461;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x6;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _6_1_ = '\0';
        local_570.type_._0_8_ = pp_Var6;
        iVar17 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,(key_type *)&local_570);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_570.type_._0_8_ != pp_Var6) {
          operator_delete((void *)local_570.type_._0_8_);
        }
        if (iVar17.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
          local_590.field_2._M_local_buf[4] = 'e';
          local_590.field_2._M_local_buf[5] = 'r';
          local_590.field_2._M_allocated_capacity._0_2_ = 0x6568;
          local_590.field_2._M_allocated_capacity._2_2_ = 0x6461;
          local_590._M_string_length = 6;
          local_590.field_2._M_local_buf[6] = '\0';
          pvVar18 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,&local_590);
          Value::INTEGER(&local_570,1);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar18,&local_570);
          Value::~Value(&local_570);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._M_dataplus._M_p != &local_590.field_2) {
            operator_delete(local_590._M_dataplus._M_p);
          }
        }
        local_570.type_._0_8_ =
             &local_570.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_2_ = 0x6564;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _2_2_ = 0x696c;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ = 'm';
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _5_1_ = 'i';
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _6_1_ = 't';
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _7_1_ = 'e';
        local_570.is_null = true;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x9;
        local_570._25_1_ = '\0';
        iVar17 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,(key_type *)&local_570);
        if (iVar17.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
          local_4c0.field_2._M_local_buf[2] = 'p';
          local_4c0.field_2._M_allocated_capacity._0_2_ = 0x6573;
          local_4c0._M_string_length = 3;
          local_4c0.field_2._M_local_buf[3] = '\0';
          iVar19 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this_00->_M_h,&local_4c0);
          if (iVar19.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
              ._M_cur != (__node_type *)0x0) goto LAB_016ef3a9;
          local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
          local_4e0.field_2._M_local_buf[4] = 'm';
          local_4e0.field_2._M_allocated_capacity._0_4_ = 0x696c6564;
          local_4e0._M_string_length = 5;
          local_4e0.field_2._M_local_buf[5] = '\0';
          iVar19 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this_00->_M_h,&local_4e0);
          bVar23 = iVar19.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
                   ._M_cur == (__node_type *)0x0;
          bVar4 = true;
        }
        else {
LAB_016ef3a9:
          bVar4 = false;
          bVar23 = false;
        }
        if ((bVar4) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e0._M_dataplus._M_p != &local_4e0.field_2)) {
          operator_delete(local_4e0._M_dataplus._M_p);
        }
        if ((iVar17.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
             ._M_cur == (__node_type *)0x0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2)) {
          operator_delete(local_4c0._M_dataplus._M_p);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_570.type_._0_8_ !=
            &local_570.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete((void *)local_570.type_._0_8_);
        }
        if (bVar23) {
          local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
          local_590.field_2._M_allocated_capacity._0_2_ = 0x6564;
          local_590.field_2._M_allocated_capacity._2_2_ = 0x696c;
          local_590.field_2._M_local_buf[4] = 'm';
          local_590.field_2._M_local_buf[5] = 'i';
          local_590.field_2._M_local_buf[6] = 't';
          local_590.field_2._M_local_buf[7] = 'e';
          local_590.field_2._M_local_buf[8] = 'r';
          local_590._M_string_length = 9;
          local_590.field_2._M_local_buf[9] = '\0';
          pvVar18 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,&local_590);
          Value::Value(&local_570,",");
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar18,&local_570);
          Value::~Value(&local_570);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._M_dataplus._M_p != &local_590.field_2) {
            operator_delete(local_590._M_dataplus._M_p);
          }
        }
        pp_Var6 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  &local_570.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ = 'e';
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_2_ = 0x7571;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _2_2_ = 0x746f;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x5;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _5_1_ = '\0';
        local_570.type_._0_8_ = pp_Var6;
        iVar17 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,(key_type *)&local_570);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_570.type_._0_8_ != pp_Var6) {
          operator_delete((void *)local_570.type_._0_8_);
        }
        if (iVar17.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
          local_590.field_2._M_local_buf[4] = 'e';
          local_590.field_2._M_allocated_capacity._0_2_ = 0x7571;
          local_590.field_2._M_allocated_capacity._2_2_ = 0x746f;
          local_590._M_string_length = 5;
          local_590.field_2._M_local_buf[5] = '\0';
          pvVar18 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,&local_590);
          Value::Value(&local_570,"\"");
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar18,&local_570);
          Value::~Value(&local_570);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._M_dataplus._M_p != &local_590.field_2) {
            operator_delete(local_590._M_dataplus._M_p);
          }
        }
        pp_Var6 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                  &local_570.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
        local_570.is_null = true;
        local_570._25_1_ = '_';
        local_570._26_4_ = 0x6c6c756e;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_2_ = 0x6f66;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _2_2_ = 0x6372;
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ = 'e';
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _5_1_ = '_';
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _6_1_ = 'n';
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _7_1_ = 'o';
        local_570.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0xe;
        local_570._30_1_ = '\0';
        local_570.type_._0_8_ = pp_Var6;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase(&this_00->_M_h,&local_570);
        pbVar20 = local_3b8;
        pbVar5 = local_3b0;
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_570.type_._0_8_ != pp_Var6) {
          operator_delete((void *)local_570.type_._0_8_);
          pbVar20 = local_3b8;
          pbVar5 = local_3b0;
        }
        for (; pbVar20 != pbVar5; pbVar20 = pbVar20 + 1) {
          local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
          local_590.field_2._M_local_buf[8] = 't';
          local_590.field_2._M_local_buf[9] = '_';
          local_590.field_2._10_4_ = 0x6c6c756e;
          local_590.field_2._M_allocated_capacity._0_2_ = 0x6f66;
          local_590.field_2._M_allocated_capacity._2_2_ = 0x6372;
          local_590.field_2._M_local_buf[4] = 'e';
          local_590.field_2._M_local_buf[5] = '_';
          local_590.field_2._M_local_buf[6] = 'n';
          local_590.field_2._M_local_buf[7] = 'o';
          local_590._M_string_length = 0xe;
          local_590.field_2._M_local_buf[0xe] = '\0';
          pvVar18 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,&local_590);
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
          pcVar3 = (pbVar20->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3a0,pcVar3,pcVar3 + pbVar20->_M_string_length);
          Value::Value(&local_570,&local_3a0);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar18,&local_570);
          Value::~Value(&local_570);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._M_dataplus._M_p != &local_590.field_2) {
            operator_delete(local_590._M_dataplus._M_p);
          }
        }
      }
      for (p_Var22 = (local_4f0->options)._M_h._M_before_begin._M_nxt;
          p_Var22 != (_Hash_node_base *)0x0; p_Var22 = p_Var22->_M_nxt) {
        iVar9 = ::std::__cxx11::string::compare((char *)(p_Var22 + 1));
        if (iVar9 != 0) {
          pvVar18 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)(p_Var22 + 5);
          if (p_Var22[5]._M_nxt == p_Var22[6]._M_nxt) {
            Value::Value(&local_570,1);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>(pvVar18,&local_570);
            Value::~Value(&local_570);
          }
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar1,(char *)p_Var22[1]._M_nxt,(long)p_Var22[2]._M_nxt);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
          if ((long)p_Var22[6]._M_nxt - (long)p_Var22[5]._M_nxt == 0x40) {
            pvVar16 = vector<duckdb::Value,_true>::operator[]
                                ((vector<duckdb::Value,_true> *)pvVar18,0);
            Value::ToSQLString_abi_cxx11_((string *)&local_570,pvVar16);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar1,(char *)local_570.type_._0_8_,
                       (long)local_570.type_.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_570.type_._0_8_ !=
                &local_570.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
            {
              operator_delete((void *)local_570.type_._0_8_);
            }
          }
          else {
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
            if (p_Var22[6]._M_nxt != p_Var22[5]._M_nxt) {
              __n = 0;
              do {
                pvVar16 = vector<duckdb::Value,_true>::operator[]
                                    ((vector<duckdb::Value,_true> *)pvVar18,__n);
                Value::ToSQLString_abi_cxx11_((string *)&local_570,pvVar16);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar1,(char *)local_570.type_._0_8_,
                           (long)local_570.type_.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
                if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_570.type_._0_8_ !=
                    &local_570.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount) {
                  operator_delete((void *)local_570.type_._0_8_);
                }
                if (__n != ((long)p_Var22[6]._M_nxt - (long)p_Var22[5]._M_nxt >> 6) - 1U) {
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
                }
                __n = __n + 1;
              } while (__n < (ulong)((long)p_Var22[6]._M_nxt - (long)p_Var22[5]._M_nxt >> 6));
            }
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
          }
        }
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,");",2);
      this_01 = local_4f8;
      local_570.type_.id_ = 10;
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_570,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3b8);
      if (local_3d8._M_p != local_3c8) {
        operator_delete(local_3d8._M_p);
      }
      if (local_3f8._M_p != local_3e8) {
        operator_delete(local_3f8._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      if ((CreateInfo *)local_438._0_8_ != (CreateInfo *)(local_438 + 0x10)) {
        operator_delete((void *)local_438._0_8_);
      }
      local_530 = local_530 + 1;
    }
    pCVar10 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                        (local_520);
    local_570.type_._0_8_ =
         &local_570.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"load.sql","");
    FileSystem::JoinPath((string *)local_438,this_01,&pCVar10->file_path,(string *)&local_570);
    WriteStringStreamToFile(this_01,(stringstream *)local_340,(string *)local_438);
    if ((CreateInfo *)local_438._0_8_ != (CreateInfo *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_570.type_._0_8_ !=
        &local_570.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_570.type_._0_8_);
    }
    *(undefined1 *)&local_480[1]._vptr_GlobalSourceState = 1;
    ::std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    ::std::ios_base::~ios_base(aiStack_2c0);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    ::std::ios_base::~ios_base(aiStack_138);
    if (local_518.
        super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_518.
                      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalExport::GetData(ExecutionContext &context, DataChunk &chunk,
                                         OperatorSourceInput &input) const {
	auto &state = input.global_state.Cast<ExportSourceState>();
	if (state.finished) {
		return SourceResultType::FINISHED;
	}

	auto &ccontext = context.client;
	auto &fs = FileSystem::GetFileSystem(ccontext);

	auto &catalog = Catalog::GetCatalog(ccontext, info->catalog);

	catalog_entry_vector_t catalog_entries;
	catalog_entries = GetNaiveExportOrder(context.client, catalog);
	auto dependency_manager = catalog.GetDependencyManager();
	if (dependency_manager) {
		dependency_manager->ReorderEntries(catalog_entries, ccontext);
	}

	// write the schema.sql file
	stringstream ss;
	WriteCatalogEntries(ss, catalog_entries);
	WriteStringStreamToFile(fs, ss, fs.JoinPath(info->file_path, "schema.sql"));

	// write the load.sql file
	// for every table, we write COPY INTO statement with the specified options
	stringstream load_ss;
	for (idx_t i = 0; i < exported_tables->data.size(); i++) {
		auto exported_table_info = exported_tables->data[i].table_data;
		WriteCopyStatement(fs, load_ss, *info, exported_table_info, function);
	}
	WriteStringStreamToFile(fs, load_ss, fs.JoinPath(info->file_path, "load.sql"));
	state.finished = true;

	return SourceResultType::FINISHED;
}